

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O0

yajl_gen_status yajl_gen_double(yajl_gen g,double number)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  uint *in_RDI;
  double in_XMM0_Qa;
  uint _i;
  char i [32];
  uint local_3c;
  char local_38 [32];
  double local_18;
  uint *local_10;
  yajl_gen_status local_4;
  
  if (in_RDI[(ulong)in_RDI[1] + 4] == 7) {
    local_4 = yajl_gen_in_error_state;
  }
  else if (in_RDI[(ulong)in_RDI[1] + 4] == 6) {
    local_4 = yajl_gen_generation_complete;
  }
  else if ((in_RDI[(ulong)in_RDI[1] + 4] == 2) || (in_RDI[(ulong)in_RDI[1] + 4] == 1)) {
    local_4 = yajl_gen_keys_must_be_strings;
  }
  else {
    if (!NAN(in_XMM0_Qa)) {
      iVar7 = 1;
      if ((long)in_XMM0_Qa < 0) {
        iVar7 = -1;
      }
      iVar4 = 0;
      if (ABS(in_XMM0_Qa) == INFINITY) {
        iVar4 = iVar7;
      }
      if (iVar4 == 0) {
        local_18 = in_XMM0_Qa;
        local_10 = in_RDI;
        if ((in_RDI[(ulong)in_RDI[1] + 4] == 2) || (in_RDI[(ulong)in_RDI[1] + 4] == 5)) {
          (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),",",1);
          if ((*local_10 & 1) != 0) {
            (**(code **)(local_10 + 0x84))(*(undefined8 *)(local_10 + 0x86),"\n",1);
          }
        }
        else if ((in_RDI[(ulong)in_RDI[1] + 4] == 3) &&
                ((**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),":",1),
                (*local_10 & 1) != 0)) {
          (**(code **)(local_10 + 0x84))(*(undefined8 *)(local_10 + 0x86)," ",1);
        }
        if (((*local_10 & 1) != 0) && (local_10[(ulong)local_10[1] + 4] != 3)) {
          for (local_3c = 0; local_3c < local_10[1]; local_3c = local_3c + 1) {
            pcVar1 = *(code **)(local_10 + 0x84);
            uVar2 = *(undefined8 *)(local_10 + 0x86);
            uVar3 = *(undefined8 *)(local_10 + 2);
            sVar5 = strlen(*(char **)(local_10 + 2));
            (*pcVar1)(uVar2,uVar3,sVar5 & 0xffffffff);
          }
        }
        sprintf(local_38,"%.20g",local_18);
        sVar5 = strspn(local_38,"0123456789-");
        sVar6 = strlen(local_38);
        if (sVar5 == sVar6) {
          strcat(local_38,".0");
        }
        pcVar1 = *(code **)(local_10 + 0x84);
        uVar2 = *(undefined8 *)(local_10 + 0x86);
        sVar5 = strlen(local_38);
        (*pcVar1)(uVar2,local_38,sVar5 & 0xffffffff);
        switch(local_10[(ulong)local_10[1] + 4]) {
        case 0:
          local_10[(ulong)local_10[1] + 4] = 6;
          break;
        case 1:
        case 2:
          local_10[(ulong)local_10[1] + 4] = 3;
          break;
        case 3:
          local_10[(ulong)local_10[1] + 4] = 2;
          break;
        case 4:
          local_10[(ulong)local_10[1] + 4] = 5;
        }
        if (((*local_10 & 1) != 0) && (local_10[(ulong)local_10[1] + 4] == 6)) {
          (**(code **)(local_10 + 0x84))(*(undefined8 *)(local_10 + 0x86),"\n",1);
        }
        return yajl_gen_status_ok;
      }
    }
    local_4 = yajl_gen_invalid_number;
  }
  return local_4;
}

Assistant:

yajl_gen_status
yajl_gen_double(yajl_gen g, double number)
{
    char i[32];
    ENSURE_VALID_STATE; ENSURE_NOT_KEY;
    if (isnan(number) || isinf(number)) return yajl_gen_invalid_number;
    INSERT_SEP; INSERT_WHITESPACE;
    sprintf(i, "%.20g", number);
    if (strspn(i, "0123456789-") == strlen(i)) {
        strcat(i, ".0");
    }
    g->print(g->ctx, i, (unsigned int)strlen(i));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}